

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cc
# Opt level: O2

PcodeOp * __thiscall FlowInfo::target(FlowInfo *this,Address *addr)

{
  const_iterator cVar1;
  PcodeOp *pPVar2;
  ostream *poVar3;
  LowlevelError *this_00;
  string sStack_1c8;
  ostringstream errmsg;
  
  cVar1 = std::
          _Rb_tree<Address,_std::pair<const_Address,_FlowInfo::VisitStat>,_std::_Select1st<std::pair<const_Address,_FlowInfo::VisitStat>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_FlowInfo::VisitStat>_>_>
          ::find(&(this->visited)._M_t,addr);
  do {
    if ((_Rb_tree_header *)cVar1._M_node == &(this->visited)._M_t._M_impl.super__Rb_tree_header) {
LAB_002c2258:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errmsg);
      std::operator<<((ostream *)&errmsg,"Could not find op at target address: (");
      poVar3 = std::operator<<((ostream *)&errmsg,(string *)&addr->base->name);
      std::operator<<(poVar3,',');
      Address::printRaw(addr,(ostream *)&errmsg);
      std::operator<<((ostream *)&errmsg,')');
      this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      LowlevelError::LowlevelError(this_00,&sStack_1c8);
      __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    if (cVar1._M_node[1]._M_left != (_Base_ptr)0x0) {
      pPVar2 = PcodeOpBank::findOp(this->obank,(SeqNum *)&cVar1._M_node[1]._M_left);
      if (pPVar2 != (PcodeOp *)0x0) {
        return pPVar2;
      }
      goto LAB_002c2258;
    }
    Address::operator+((Address *)&errmsg,(int)cVar1._M_node + 0x20);
    cVar1 = std::
            _Rb_tree<Address,_std::pair<const_Address,_FlowInfo::VisitStat>,_std::_Select1st<std::pair<const_Address,_FlowInfo::VisitStat>_>,_std::less<Address>,_std::allocator<std::pair<const_Address,_FlowInfo::VisitStat>_>_>
            ::find(&(this->visited)._M_t,(Address *)&errmsg);
  } while( true );
}

Assistant:

PcodeOp *FlowInfo::target(const Address &addr) const

{
  map<Address,VisitStat>::const_iterator iter;

  iter = visited.find(addr);
  while(iter != visited.end()) {
    const SeqNum &seq( (*iter).second.seqnum );
    if (!seq.getAddr().isInvalid()) {
      PcodeOp *retop = obank.findOp(seq);
      if (retop != (PcodeOp *)0)
	return retop;
      break;
    }
    // Visit fall thru address in case of no-op
    iter = visited.find( (*iter).first + (*iter).second.size );
  }
  ostringstream errmsg;
  errmsg << "Could not find op at target address: (";
  errmsg << addr.getSpace()->getName() << ',';
  addr.printRaw(errmsg);
  errmsg << ')';
  throw LowlevelError(errmsg.str());
}